

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O2

void schedule_itimer(int msec)

{
  int iVar1;
  int *piVar2;
  itimerval local_38;
  
  local_38.it_interval.tv_sec = 0;
  local_38.it_interval.tv_usec = 0;
  local_38.it_value.tv_sec = (ulong)(uint)msec / 1000;
  local_38.it_value.tv_usec = (__suseconds_t)(((uint)msec % 1000) * 1000);
  s.sig_alrm = 0;
  do {
    iVar1 = setitimer(ITIMER_REAL,&local_38,(itimerval *)0x0);
    if (-1 < iVar1) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  err(1,"setitimer %i msec",msec);
}

Assistant:

static void schedule_itimer(int msec)
{
	int ret;
	struct itimerval val = { 0 };

	val.it_value.tv_sec = msec / 1000;
	val.it_value.tv_usec = (msec % 1000) * 1000;

	s.sig_alrm = 0;
	do {
		ret = setitimer(ITIMER_REAL, &val, NULL);
	} while ((ret < 0) && (errno == EINTR));
	if (ret < 0)
		err(1, "setitimer %i msec", msec);
}